

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O3

void __thiscall HEkkDualRHS::chooseNormal(HEkkDualRHS *this,HighsInt *chIndex)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint32_t uVar10;
  undefined8 in_RAX;
  int iVar11;
  ulong uVar12;
  uint sup;
  ulong uVar13;
  uint32_t uVar14;
  long lVar15;
  uint uVar16;
  HEkk *pHVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  undefined8 uStack_38;
  
  if (this->workCount == 0) {
    *chIndex = -1;
    return;
  }
  uStack_38 = in_RAX;
  bVar8 = HighsSimplexAnalysis::simplexTimerRunning(this->analysis,0x26,0);
  if (!bVar8) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  }
  pHVar17 = this->ekk_instance_;
  sup = this->workCount;
  if ((int)sup < 0) {
    uVar9 = -sup;
    uVar10 = 0;
    if (1 < uVar9) {
      uVar4 = 0x1f;
      if (~sup != 0) {
        for (; ~sup >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar10 = HighsRandom::drawUniform(&pHVar17->random_,uVar9,(uVar4 ^ 0xffffffe0) + 0x21);
    }
    uVar12 = 0xffffffff;
    dVar19 = 0.0;
    bVar7 = true;
    do {
      bVar6 = bVar7;
      uVar14 = uVar10;
      uVar5 = 0;
      if (bVar6) {
        uVar14 = uVar9;
        uVar5 = uVar10;
      }
      if ((int)uVar5 < (int)uVar14) {
        uVar13 = (ulong)(int)uVar5;
        do {
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar13];
          if (1e-50 < dVar1) {
            dVar2 = (pHVar17->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13];
            dVar20 = dVar19 * dVar2;
            if (dVar20 < dVar1) {
              uVar12 = uVar13 & 0xffffffff;
            }
            uVar18 = -(ulong)(dVar20 < dVar1);
            dVar19 = (double)(~uVar18 & (ulong)dVar19 | (ulong)(dVar1 / dVar2) & uVar18);
          }
          uVar13 = uVar13 + 1;
        } while ((long)(int)uVar14 != uVar13);
      }
      bVar7 = false;
    } while (bVar6);
    *chIndex = (HighsInt)uVar12;
    goto LAB_00352dfa;
  }
  uVar9 = 0;
  if (1 < sup) {
    uVar9 = 0x1f;
    if (sup - 1 != 0) {
      for (; sup - 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = HighsRandom::drawUniform(&pHVar17->random_,sup,(uVar9 ^ 0xffffffe0) + 0x21);
    pHVar17 = this->ekk_instance_;
    sup = this->workCount;
  }
  iVar11 = -1;
  dVar19 = 0.0;
  bVar7 = true;
  do {
    bVar6 = bVar7;
    uVar16 = uVar9;
    uVar4 = 0;
    if (bVar6) {
      uVar16 = sup;
      uVar4 = uVar9;
    }
    if ((int)uVar4 < (int)uVar16) {
      lVar15 = (long)(int)uVar4;
      do {
        iVar3 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15];
        dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3];
        if ((1e-50 < dVar1) &&
           (dVar2 = (pHVar17->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3], dVar19 * dVar2 < dVar1)) {
          dVar19 = dVar1 / dVar2;
          iVar11 = iVar3;
        }
        lVar15 = lVar15 + 1;
      } while ((int)uVar16 != lVar15);
    }
    bVar7 = false;
  } while (bVar6);
  uStack_38 = CONCAT44(iVar11,(undefined4)uStack_38);
  if (iVar11 == -1) {
    iVar11 = -1;
    if (0.0 < this->workCutoff) goto LAB_00352d13;
  }
  else if (dVar19 <= this->workCutoff * 0.99) {
LAB_00352d13:
    createInfeasList(this,0.0);
    chooseNormal(this,(HighsInt *)((long)&uStack_38 + 4));
    iVar11 = uStack_38._4_4_;
  }
  *chIndex = iVar11;
LAB_00352dfa:
  if (bVar8) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseNormal(HighsInt* chIndex) {
  // Moved the following to the top to avoid starting the clock for a trivial
  // call. NB Must still call HighsInt to maintain sequence of random numbers
  // for code reproducibility!! Never mind if we're not timing the random number
  // call!!
  // HighsInt random = ekk_instance_.random_.integer();
  if (workCount == 0) {
    *chIndex = -1;
    return;
  }

  // Since chooseNormal calls itself, only start the clock if it's not
  // currently running
  bool keep_timer_running = analysis->simplexTimerRunning(ChuzrDualClock);
  //      timer.clock_start[info.clock_[ChuzrDualClock]] < 0;
  if (!keep_timer_running) {
    analysis->simplexTimerStart(ChuzrDualClock);
  }

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          //	  printf("Dense: Row %4" HIGHSINT_FORMAT " weight = %g\n", iRow,
          // myWeight);
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }
    *chIndex = bestIndex;
  } else {
    // SPARSE mode
    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }

    HighsInt createListAgain = 0;
    if (bestIndex == -1) {
      createListAgain = workCutoff > 0;
    } else if (bestMerit <= workCutoff * 0.99) {
      createListAgain = 1;
    }
    if (createListAgain) {
      createInfeasList(0);
      chooseNormal(&bestIndex);
    }
    *chIndex = bestIndex;
  }
  // Since chooseNormal calls itself, only stop the clock if it's not currently
  // running
  if (!keep_timer_running) analysis->simplexTimerStop(ChuzrDualClock);
}